

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d.c
# Opt level: O3

void av1_fwd_txfm2d_64x64_c(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  byte bVar6;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [4096];
  TXFM_2D_FLIP_CFG TStack_4068;
  int32_t local_4028 [4096];
  
  bVar6 = 0;
  av1_get_fwd_txfm_cfg(tx_type,'\x04',&TStack_4068);
  fwd_txfm2d_c(input,output,stride,&TStack_4068,local_4028,bd);
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xf0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xe0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xd0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xc0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xb0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0xa0);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0x90);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)output + lVar2 + 0x80);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x100;
  } while (lVar2 != 0x2000);
  memset(output + 0x800,0,0x2000);
  lVar2 = 0x80;
  do {
    puVar4 = (undefined4 *)((long)output + lVar2 * 2);
    puVar5 = (undefined4 *)((long)output + lVar2);
    for (lVar3 = 0x20; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    lVar2 = lVar2 + 0x80;
  } while (lVar2 != 0x1000);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_c(const int16_t *input, int32_t *output, int stride,
                            TX_TYPE tx_type, int bd) {
  int32_t txfm_buf[64 * 64];
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X64, &cfg);
  fwd_txfm2d_c(input, output, stride, &cfg, txfm_buf, bd);

  // Zero out top-right 32x32 area.
  for (int col = 0; col < 32; ++col) {
    memset(output + col * 64 + 32, 0, 32 * sizeof(*output));
  }
  // Zero out the bottom 64x32 area.
  memset(output + 32 * 64, 0, 32 * 64 * sizeof(*output));
  // Re-pack non-zero coeffs in the first 32x32 indices.
  for (int col = 1; col < 32; ++col) {
    memcpy(output + col * 32, output + col * 64, 32 * sizeof(*output));
  }
}